

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureDataManager.cpp
# Opt level: O2

void __thiscall SecureDataManager::~SecureDataManager(SecureDataManager *this)

{
  CryptoFactory *pCVar1;
  MutexFactory *this_00;
  
  this->_vptr_SecureDataManager = (_func_int **)&PTR__SecureDataManager_0019e940;
  pCVar1 = CryptoFactory::i();
  (*pCVar1->_vptr_CryptoFactory[1])(pCVar1,this->aes);
  if (this->mask != (ByteString *)0x0) {
    (*this->mask->_vptr_ByteString[1])();
  }
  this_00 = MutexFactory::i();
  MutexFactory::recycleMutex(this_00,this->dataMgrMutex);
  ByteString::~ByteString(&this->magic);
  ByteString::~ByteString(&this->maskedKey);
  ByteString::~ByteString(&this->soEncryptedKey);
  ByteString::~ByteString(&this->userEncryptedKey);
  return;
}

Assistant:

SecureDataManager::~SecureDataManager()
{
	// Recycle the AES instance
	CryptoFactory::i()->recycleSymmetricAlgorithm(aes);

	// Clean up the mask
	delete mask;

	MutexFactory::i()->recycleMutex(dataMgrMutex);
}